

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

string * __thiscall QPDF::getFilename_abi_cxx11_(string *__return_storage_ptr__,QPDF *this)

{
  int iVar1;
  pointer pMVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  QPDF *this_local;
  
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar3 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar2->file);
  iVar1 = (*peVar3->_vptr_InputSource[3])();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)CONCAT44(extraout_var,iVar1));
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF::getFilename() const
{
    return m->file->getName();
}